

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::generateDSAParameters
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey,CK_BBOOL isOnToken,CK_BBOOL isPrivate)

{
  void *pvVar1;
  SoftHSM *pSVar2;
  DSAParameters *this_00;
  CK_OBJECT_HANDLE_PTR pCVar3;
  char cVar4;
  int iVar5;
  Session *this_01;
  long lVar6;
  CryptoFactory *pCVar7;
  undefined4 extraout_var;
  long *plVar8;
  ByteString *pBVar9;
  unsigned_long *puVar10;
  CK_ULONG CVar11;
  CK_ULONG CVar12;
  char *format;
  ulong uVar13;
  CK_RV CVar14;
  bool bVar15;
  AsymmetricParameters *p;
  CK_KEY_TYPE keyType;
  ByteString generator;
  ByteString subprime;
  ByteString prime;
  CK_OBJECT_CLASS objClass;
  CK_ATTRIBUTE paramsAttribs [32];
  CK_BBOOL local_671;
  SoftHSM *local_670;
  Token *local_668;
  DSAParameters *local_660;
  DSAParameters *local_658;
  long *local_650;
  CK_OBJECT_HANDLE_PTR local_648;
  undefined8 local_640;
  ByteString local_638;
  ByteString local_610;
  ByteString local_5e8;
  undefined8 local_5c0;
  OSAttribute local_5b8;
  OSAttribute local_518;
  OSAttribute local_478;
  OSAttribute local_3d8;
  _CK_ATTRIBUTE local_338;
  undefined8 local_320;
  CK_BBOOL *local_318;
  undefined8 local_310;
  undefined8 local_308;
  CK_BBOOL *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 *local_2e8;
  undefined8 local_2e0;
  
  *phKey = 0;
  local_671 = isOnToken;
  this_01 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_01 == (Session *)0x0) {
    CVar14 = 0xb3;
  }
  else {
    local_668 = Session::getToken(this_01);
    if (local_668 == (Token *)0x0) {
      CVar14 = 5;
    }
    else {
      if (ulCount == 0) {
        lVar6 = 0;
        uVar13 = 0;
      }
      else {
        puVar10 = &pTemplate->ulValueLen;
        uVar13 = 0;
        lVar6 = 0;
        CVar12 = ulCount;
        do {
          if (((_CK_ATTRIBUTE *)(puVar10 + -2))->type == 0x134) {
            if (*puVar10 != 8) {
              format = "CKA_SUB_PRIME_BITS does not have the size of CK_ULONG";
              iVar5 = 0x2306;
LAB_00138b2e:
              softHSMLog(6,"generateDSAParameters",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,iVar5,format);
              return 0x13;
            }
            lVar6 = *(long *)puVar10[-1];
          }
          else if (((_CK_ATTRIBUTE *)(puVar10 + -2))->type == 0x133) {
            if (*puVar10 != 8) {
              format = "CKA_PRIME_BITS does not have the size of CK_ULONG";
              iVar5 = 0x22fe;
              goto LAB_00138b2e;
            }
            uVar13 = *(ulong *)puVar10[-1];
          }
          puVar10 = puVar10 + 3;
          CVar12 = CVar12 - 1;
        } while (CVar12 != 0);
      }
      if (uVar13 == 0) {
        softHSMLog(6,"generateDSAParameters",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x2313,"Missing CKA_PRIME_BITS in pTemplate");
        CVar14 = 0xd0;
      }
      else {
        local_670 = this;
        if ((lVar6 != 0) &&
           (((0x7ff < uVar13 && (lVar6 != 0x100)) || ((uVar13 < 0x800 && (lVar6 != 0xa0)))))) {
          softHSMLog(6,"generateDSAParameters",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,0x231b,"CKA_SUB_PRIME_BITS is ignored");
        }
        local_660 = (DSAParameters *)0x0;
        pCVar7 = CryptoFactory::i();
        iVar5 = (*pCVar7->_vptr_CryptoFactory[2])(pCVar7,2);
        plVar8 = (long *)CONCAT44(extraout_var,iVar5);
        CVar14 = 5;
        if (plVar8 != (long *)0x0) {
          cVar4 = (**(code **)(*plVar8 + 0x78))(plVar8,&local_660,uVar13,0);
          if (cVar4 == '\0') {
            softHSMLog(3,"generateDSAParameters",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,0x2324,"Could not generate parameters");
            pCVar7 = CryptoFactory::i();
            (*pCVar7->_vptr_CryptoFactory[3])(pCVar7,plVar8);
          }
          else {
            local_658 = local_660;
            local_5c0 = 6;
            local_640 = 1;
            local_650 = plVar8;
            local_648 = phKey;
            memset(&local_338,0,0x300);
            pCVar3 = local_648;
            local_338.ulValueLen = 8;
            local_320 = 1;
            local_318 = &local_671;
            local_310 = 1;
            local_308 = 2;
            local_300 = &isPrivate;
            local_2f8 = 1;
            local_2f0 = 0x100;
            local_2e8 = &local_640;
            CVar14 = 0xd1;
            if (ulCount < 0x1d) {
              CVar14 = 0;
            }
            local_2e0 = 8;
            CVar12 = 4;
            CVar11 = CVar12;
            uVar13 = 1;
            if (ulCount - 1 < 0x1c) {
              do {
                CVar12 = CVar11;
                if ((2 < pTemplate->type) && (pTemplate->type != 0x100)) {
                  CVar12 = CVar11 + 1;
                  (&local_338)[CVar11].ulValueLen = pTemplate->ulValueLen;
                  pvVar1 = pTemplate->pValue;
                  (&local_338)[CVar11].type = pTemplate->type;
                  (&local_338)[CVar11].pValue = pvVar1;
                }
                if (0x1c < ulCount) break;
                pTemplate = pTemplate + 1;
                bVar15 = uVar13 < ulCount;
                CVar11 = CVar12;
                uVar13 = uVar13 + 1;
              } while (bVar15);
            }
            local_338.pValue = &local_5c0;
            if (ulCount < 0x1d) {
              CVar14 = CreateObject(local_670,hSession,&local_338,CVar12,local_648,4);
            }
            if (CVar14 == 0) {
              plVar8 = (long *)HandleManager::getObject(local_670->handleManager,*pCVar3);
              CVar14 = 6;
              if (((plVar8 != (long *)0x0) &&
                  (cVar4 = (**(code **)(*plVar8 + 0x50))(plVar8), cVar4 != '\0')) &&
                 (cVar4 = (**(code **)(*plVar8 + 0x58))(plVar8,1), cVar4 != '\0')) {
                OSAttribute::OSAttribute(&local_5b8,true);
                cVar4 = (**(code **)(*plVar8 + 0x40))(plVar8,0x163,&local_5b8);
                OSAttribute::~OSAttribute(&local_5b8);
                if (cVar4 == '\0') {
                  cVar4 = '\0';
                }
                else {
                  OSAttribute::OSAttribute(&local_5b8,0x2000);
                  cVar4 = (**(code **)(*plVar8 + 0x40))(plVar8,0x166,&local_5b8);
                  OSAttribute::~OSAttribute(&local_5b8);
                }
                ByteString::ByteString(&local_5e8);
                ByteString::ByteString(&local_610);
                this_00 = local_658;
                ByteString::ByteString(&local_638);
                if (isPrivate == '\0') {
                  pBVar9 = DSAParameters::getP(this_00);
                  ByteString::operator=(&local_5e8,pBVar9);
                  pBVar9 = DSAParameters::getQ(this_00);
                  ByteString::operator=(&local_610,pBVar9);
                  pBVar9 = DSAParameters::getG(this_00);
                  ByteString::operator=(&local_638,pBVar9);
                }
                else {
                  pBVar9 = DSAParameters::getP(this_00);
                  Token::encrypt(local_668,(char *)pBVar9,(int)&local_5e8);
                  pBVar9 = DSAParameters::getQ(this_00);
                  Token::encrypt(local_668,(char *)pBVar9,(int)&local_610);
                  pBVar9 = DSAParameters::getG(this_00);
                  Token::encrypt(local_668,(char *)pBVar9,(int)&local_638);
                }
                if (cVar4 == '\0') {
                  cVar4 = '\0';
                }
                else {
                  OSAttribute::OSAttribute(&local_3d8,&local_5e8);
                  cVar4 = (**(code **)(*plVar8 + 0x40))(plVar8,0x130,&local_3d8);
                  OSAttribute::~OSAttribute(&local_3d8);
                }
                if (cVar4 == '\0') {
                  cVar4 = '\0';
                }
                else {
                  OSAttribute::OSAttribute(&local_478,&local_610);
                  cVar4 = (**(code **)(*plVar8 + 0x40))(plVar8,0x131,&local_478);
                  OSAttribute::~OSAttribute(&local_478);
                }
                if (cVar4 == '\0') {
                  cVar4 = '\0';
                }
                else {
                  OSAttribute::OSAttribute(&local_518,&local_638);
                  cVar4 = (**(code **)(*plVar8 + 0x40))(plVar8,0x132,&local_518);
                  OSAttribute::~OSAttribute(&local_518);
                }
                if (cVar4 == '\0') {
                  (**(code **)(*plVar8 + 0x68))(plVar8);
                  cVar4 = '\0';
                }
                else {
                  cVar4 = (**(code **)(*plVar8 + 0x60))(plVar8);
                }
                CVar14 = 6;
                if (cVar4 != '\0') {
                  CVar14 = 0;
                }
                local_638._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          (&local_638.byteString.
                            super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                local_610._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          (&local_610.byteString.
                            super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                local_5e8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          (&local_5e8.byteString.
                            super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
              }
            }
            plVar8 = local_650;
            (**(code **)(*local_650 + 200))(local_650,local_660);
            pCVar7 = CryptoFactory::i();
            (*pCVar7->_vptr_CryptoFactory[3])(pCVar7,plVar8);
            pSVar2 = local_670;
            if ((CVar14 != 0) && (*pCVar3 != 0)) {
              plVar8 = (long *)HandleManager::getObject(local_670->handleManager,*pCVar3);
              HandleManager::destroyObject(pSVar2->handleManager,*pCVar3);
              if (plVar8 != (long *)0x0) {
                (**(code **)(*plVar8 + 0x70))(plVar8);
              }
              *pCVar3 = 0;
            }
          }
        }
      }
    }
  }
  return CVar14;
}

Assistant:

CK_RV SoftHSM::generateDSAParameters
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	size_t bitLen = 0;
	size_t qLen = 0;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_PRIME_BITS:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_PRIME_BITS does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				bitLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			case CKA_SUB_PRIME_BITS:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_SUB_PRIME_BITS does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				qLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			default:
				break;
		}
	}

	// CKA_PRIME_BITS must be specified
	if (bitLen == 0)
	{
		INFO_MSG("Missing CKA_PRIME_BITS in pTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// No real choice for CKA_SUB_PRIME_BITS
	if ((qLen != 0) &&
	    (((bitLen >= 2048) && (qLen != 256)) ||
	     ((bitLen < 2048) && (qLen != 160))))
		INFO_MSG("CKA_SUB_PRIME_BITS is ignored");


	// Generate domain parameters
	AsymmetricParameters* p = NULL;
	AsymmetricAlgorithm* dsa = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::DSA);
	if (dsa == NULL) return CKR_GENERAL_ERROR;
	if (!dsa->generateParameters(&p, (void *)bitLen))
	{
		ERROR_MSG("Could not generate parameters");
		CryptoFactory::i()->recycleAsymmetricAlgorithm(dsa);
		return CKR_GENERAL_ERROR;
	}

	DSAParameters* params = (DSAParameters*) p;

	CK_RV rv = CKR_OK;

	// Create the domain parameter object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_DOMAIN_PARAMETERS;
	CK_KEY_TYPE keyType = CKK_DSA;
	CK_ATTRIBUTE paramsAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG paramsAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - paramsAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
				continue;
		default:
			paramsAttribs[paramsAttribsCount++] = pTemplate[i];
		}
	}

	if (rv == CKR_OK)
		rv = this->CreateObject(hSession, paramsAttribs, paramsAttribsCount, phKey,OBJECT_OP_GENERATE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
			CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_DSA_PARAMETER_GEN;
			bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

			// DSA Domain Parameters Attributes
			ByteString prime;
			ByteString subprime;
			ByteString generator;
			if (isPrivate)
			{
				token->encrypt(params->getP(), prime);
				token->encrypt(params->getQ(), subprime);
				token->encrypt(params->getG(), generator);
			}
			else
			{
				prime = params->getP();
				subprime = params->getQ();
				generator = params->getG();
			}
			bOK = bOK && osobject->setAttribute(CKA_PRIME, prime);
			bOK = bOK && osobject->setAttribute(CKA_SUBPRIME, subprime);
			bOK = bOK && osobject->setAttribute(CKA_BASE, generator);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	dsa->recycleParameters(p);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(dsa);

	// Remove parameters that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* osparams = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (osparams) osparams->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}